

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SkipCommentAndWhitespaceAndNewline
          (AsciiParser *this,bool allow_semicolon)

{
  ulong uVar1;
  int *piVar2;
  uint8_t uVar3;
  StreamReader *pSVar4;
  ulong uVar5;
  bool bVar6;
  char cVar7;
  ulong uVar8;
  byte unaff_R15B;
  
  do {
    pSVar4 = this->_sr;
    uVar8 = pSVar4->length_;
    uVar5 = pSVar4->idx_;
    if (uVar8 <= uVar5) {
      return true;
    }
    if (pSVar4->binary_[uVar5] == '\0') {
      return true;
    }
    uVar1 = uVar5 + 1;
    if (uVar1 <= uVar8) {
      unaff_R15B = pSVar4->binary_[uVar5];
      pSVar4->idx_ = uVar1;
    }
    cVar7 = '\x01';
    if (uVar1 <= uVar8) {
      if (unaff_R15B < 0x20) {
        if ((unaff_R15B == 9) || (unaff_R15B == 0xc)) {
LAB_003380b1:
          piVar2 = &(this->_curr_cursor).col;
          *piVar2 = *piVar2 + 1;
        }
        else {
LAB_003380a4:
          if (unaff_R15B == 0x3b && allow_semicolon) goto LAB_003380b1;
          if (unaff_R15B == 0xd) {
            uVar5 = pSVar4->idx_;
            if (uVar5 < uVar8 - 1) {
              if (uVar8 < uVar5 + 1) goto LAB_003380b7;
              uVar3 = pSVar4->binary_[uVar5];
              pSVar4->idx_ = uVar5 + 1;
              if (uVar3 != '\n') {
                if (((long)pSVar4->idx_ < 1) || (uVar8 = pSVar4->idx_ - 1, pSVar4->length_ < uVar8))
                goto LAB_003380b7;
                pSVar4->idx_ = uVar8;
              }
            }
          }
          else if (unaff_R15B != 10) {
            if ((0 < (long)pSVar4->idx_) && (uVar8 = pSVar4->idx_ - 1, uVar8 <= pSVar4->length_)) {
              pSVar4->idx_ = uVar8;
              cVar7 = '\x03';
            }
            goto LAB_003380b7;
          }
          (this->_curr_cursor).col = 0;
          (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
        }
        cVar7 = '\0';
      }
      else {
        if (unaff_R15B == 0x20) goto LAB_003380b1;
        if (unaff_R15B != 0x23) goto LAB_003380a4;
        bVar6 = SkipUntilNewline(this);
        cVar7 = !bVar6;
      }
    }
LAB_003380b7:
    if (cVar7 != '\0') {
      return cVar7 == '\x03';
    }
  } while( true );
}

Assistant:

bool AsciiParser::SkipCommentAndWhitespaceAndNewline(
    const bool allow_semicolon) {
  // Skip multiple line of comments.
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    // printf("sws c = %c\n", c);

    if (c == '#') {
      if (!SkipUntilNewline()) {
        return false;
      }
    } else if ((c == ' ') || (c == '\t') || (c == '\f')) {
      _curr_cursor.col++;
      // continue
    } else if (allow_semicolon && (c == ';')) {
      _curr_cursor.col++;
      // continue
    } else if (c == '\n') {
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          // CRLF
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            return false;
          }
        }
      }
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else {
      // std::cout << "unwind\n";
      // end loop
      if (!_sr->seek_from_current(-1)) {
        return false;
      }
      break;
    }
  }

  return true;
}